

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O0

object_kind * borg_guess_kind(uint8_t a,wchar_t c,wchar_t y,wchar_t x)

{
  chunk_conflict *c_00;
  loc_conflict grid;
  object *poVar1;
  object *o_ptr;
  wchar_t x_local;
  wchar_t y_local;
  wchar_t c_local;
  uint8_t a_local;
  
  c_00 = cave;
  grid = (loc_conflict)loc(x,y);
  poVar1 = borg_get_top_object((chunk *)c_00,grid);
  if (poVar1 == (object *)0x0) {
    _c_local = (object_kind *)0x0;
  }
  else {
    _c_local = poVar1->kind;
  }
  return _c_local;
}

Assistant:

static struct object_kind *borg_guess_kind(uint8_t a, wchar_t c, int y, int x)
{
    /* ok, this is an real cheat.  he ought to use the look command
     * in order to correctly id the object.  But I am passing that up for
     * the sake of speed and accuracy
     */

    /* Cheat the Actual item */
    struct object *o_ptr = borg_get_top_object(cave, loc(x, y));
    if (!o_ptr)
        return NULL;
    return (o_ptr->kind);
}